

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IStreamingReporter * __thiscall
Catch::ReporterRegistry::create
          (ReporterRegistry *this,string *name,Ptr<const_Catch::IConfig> *config)

{
  long *plVar1;
  int iVar2;
  const_iterator cVar3;
  undefined4 extraout_var;
  IStreamingReporter *pIVar4;
  undefined8 local_20;
  IConfig *local_18;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Ptr<Catch::IReporterFactory>_>_>_>
          ::find(&(this->m_factories)._M_t,name);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->m_factories)._M_t._M_impl.super__Rb_tree_header) {
    pIVar4 = (IStreamingReporter *)0x0;
  }
  else {
    plVar1 = *(long **)(cVar3._M_node + 2);
    iVar2 = (*(config->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[5])();
    local_20 = CONCAT44(extraout_var,iVar2);
    local_18 = config->m_p;
    if (local_18 != (IConfig *)0x0) {
      (*(local_18->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
    }
    pIVar4 = (IStreamingReporter *)(**(code **)(*plVar1 + 0x20))(plVar1,&local_20);
    if (local_18 != (IConfig *)0x0) {
      (*(local_18->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
    }
  }
  return pIVar4;
}

Assistant:

virtual IStreamingReporter* create( std::string const& name, Ptr<IConfig const> const& config ) const CATCH_OVERRIDE {
            FactoryMap::const_iterator it =  m_factories.find( name );
            if( it == m_factories.end() )
                return CATCH_NULL;
            return it->second->create( ReporterConfig( config ) );
        }